

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cc
# Opt level: O1

void __thiscall duckdb_re2::CharClassBuilder::RemoveAbove(CharClassBuilder *this,Rune r)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  uint uVar4;
  const_iterator __position;
  RuneRange rr;
  RuneRange local_38;
  
  if (r < 0x10ffff) {
    if (r < 0x7a) {
      if (r < 0x61) {
        this->lower_ = 0;
      }
      else {
        this->lower_ = this->lower_ & 0x3ffffffU >> (0x7aU - (char)r & 0x1f);
      }
    }
    if (r < 0x5a) {
      uVar4 = 0;
      if (0x40 < r) {
        uVar4 = 0x3ffffffU >> (0x5aU - (char)r & 0x1f) & this->upper_;
      }
      this->upper_ = uVar4;
    }
    p_Var1 = &(this->ranges_)._M_t._M_impl.super__Rb_tree_header;
    do {
      p_Var2 = (this->ranges_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
      p_Var3 = &p_Var1->_M_header;
      for (; (_Rb_tree_header *)p_Var2 != (_Rb_tree_header *)0x0;
          p_Var2 = (&p_Var2->_M_left)[*(int *)((long)(p_Var2 + 1) + 4) <= r]) {
        if (r < *(int *)((long)(p_Var2 + 1) + 4)) {
          p_Var3 = p_Var2;
        }
      }
      __position._M_node = &p_Var1->_M_header;
      if (((_Rb_tree_header *)p_Var3 != p_Var1) &&
         (__position._M_node = p_Var3, 0x10ffff < (int)p_Var3[1]._M_color)) {
        __position._M_node = &p_Var1->_M_header;
      }
      if ((_Rb_tree_header *)__position._M_node == p_Var1) {
        return;
      }
      local_38.lo = __position._M_node[1]._M_color;
      local_38.hi = *(Rune *)&__position._M_node[1].field_0x4;
      std::
      _Rb_tree<duckdb_re2::RuneRange,duckdb_re2::RuneRange,std::_Identity<duckdb_re2::RuneRange>,duckdb_re2::RuneRangeLess,std::allocator<duckdb_re2::RuneRange>>
      ::erase_abi_cxx11_((_Rb_tree<duckdb_re2::RuneRange,duckdb_re2::RuneRange,std::_Identity<duckdb_re2::RuneRange>,duckdb_re2::RuneRangeLess,std::allocator<duckdb_re2::RuneRange>>
                          *)&this->ranges_,__position);
      this->nrunes_ = this->nrunes_ + ~local_38.hi + local_38.lo;
      if (local_38.lo <= r) {
        local_38.hi = r;
        std::
        _Rb_tree<duckdb_re2::RuneRange,duckdb_re2::RuneRange,std::_Identity<duckdb_re2::RuneRange>,duckdb_re2::RuneRangeLess,std::allocator<duckdb_re2::RuneRange>>
        ::_M_insert_unique<duckdb_re2::RuneRange_const&>
                  ((_Rb_tree<duckdb_re2::RuneRange,duckdb_re2::RuneRange,std::_Identity<duckdb_re2::RuneRange>,duckdb_re2::RuneRangeLess,std::allocator<duckdb_re2::RuneRange>>
                    *)&this->ranges_,&local_38);
        this->nrunes_ = (local_38.hi - local_38.lo) + this->nrunes_ + 1;
      }
    } while ((_Rb_tree_header *)__position._M_node != p_Var1);
  }
  return;
}

Assistant:

void CharClassBuilder::RemoveAbove(Rune r) {
  if (r >= Runemax)
    return;

  if (r < 'z') {
    if (r < 'a')
      lower_ = 0;
    else
      lower_ &= AlphaMask >> ('z' - r);
  }

  if (r < 'Z') {
    if (r < 'A')
      upper_ = 0;
    else
      upper_ &= AlphaMask >> ('Z' - r);
  }

  for (;;) {

    iterator it = ranges_.find(RuneRange(r + 1, Runemax));
    if (it == end())
      break;
    RuneRange rr = *it;
    ranges_.erase(it);
    nrunes_ -= rr.hi - rr.lo + 1;
    if (rr.lo <= r) {
      rr.hi = r;
      ranges_.insert(rr);
      nrunes_ += rr.hi - rr.lo + 1;
    }
  }
}